

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::ExceptionImpl::ExceptionImpl(ExceptionImpl *this,Exception *other)

{
  int iVar1;
  Type TVar2;
  
  (this->super_Exception).ownFile.content.ptr = (other->ownFile).content.ptr;
  (this->super_Exception).ownFile.content.size_ = (other->ownFile).content.size_;
  (this->super_Exception).ownFile.content.disposer = (other->ownFile).content.disposer;
  (other->ownFile).content.ptr = (char *)0x0;
  (other->ownFile).content.size_ = 0;
  iVar1 = other->line;
  TVar2 = other->type;
  (this->super_Exception).file = other->file;
  (this->super_Exception).line = iVar1;
  (this->super_Exception).type = TVar2;
  (this->super_Exception).description.content.ptr = (other->description).content.ptr;
  (this->super_Exception).description.content.size_ = (other->description).content.size_;
  (this->super_Exception).description.content.disposer = (other->description).content.disposer;
  (other->description).content.ptr = (char *)0x0;
  (other->description).content.size_ = 0;
  (this->super_Exception).context.ptr.disposer = (other->context).ptr.disposer;
  (this->super_Exception).context.ptr.ptr = (other->context).ptr.ptr;
  (other->context).ptr.ptr = (Context *)0x0;
  memcpy((this->super_Exception).trace,other->trace,0x104);
  *(undefined ***)this = &PTR__ExceptionImpl_0046afa8;
  (this->whatBuffer).content.ptr = (char *)0x0;
  (this->whatBuffer).content.size_ = 0;
  (this->whatBuffer).content.disposer = (ArrayDisposer *)0x0;
  return;
}

Assistant:

inline ExceptionImpl(Exception&& other): Exception(mv(other)) {}